

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

ps_seg_t * allphone_search_seg_iter(ps_search_t *search)

{
  long lVar1;
  ps_segfuncs_t *ppVar2;
  ps_seg_t *seg;
  
  seg = (ps_seg_t *)0x0;
  allphone_backtrace((allphone_search_t *)search,*(int *)&search[1].d2p + -1,(int32 *)0x0);
  lVar1._0_4_ = search[1].post;
  lVar1._4_4_ = search[1].n_words;
  if (lVar1 != 0) {
    seg = (ps_seg_t *)
          __ckd_calloc__(1,0x40,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                         ,0x7a);
    seg->vt = &fsg_segfuncs;
    seg->search = search;
    ppVar2 = *(ps_segfuncs_t **)&search[1].post;
    seg[1].vt = ppVar2;
    allphone_search_fill_iter(seg,(phseg_t *)ppVar2->seg_next);
  }
  return seg;
}

Assistant:

static ps_seg_t *
allphone_search_seg_iter(ps_search_t * search)
{
    allphone_search_t *allphs = (allphone_search_t *) search;
    phseg_iter_t *iter;

    allphone_backtrace(allphs, allphs->frame - 1, NULL);
    if (allphs->segments == NULL)
        return NULL;
    
    iter = ckd_calloc(1, sizeof(phseg_iter_t));

    iter->base.vt = &fsg_segfuncs;
    iter->base.search = search;
    iter->seg = allphs->segments;
    allphone_search_fill_iter((ps_seg_t *)iter, gnode_ptr(iter->seg));

    return (ps_seg_t *) iter;
}